

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

bool __thiscall
ON_OffsetSurfaceFunction::SetBaseSurface(ON_OffsetSurfaceFunction *this,ON_Surface *srf)

{
  bool bVar1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 in_XMM1_Qa;
  
  Destroy(this);
  this->m_srf = srf;
  if (srf != (ON_Surface *)0x0) {
    (*(srf->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(srf,0);
    *(undefined8 *)&this->field_0x8 = extraout_XMM0_Qa;
    *(undefined8 *)&this->field_0x10 = in_XMM1_Qa;
    (*(this->m_srf->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this->m_srf,1);
    *(undefined8 *)&this->field_0x18 = extraout_XMM0_Qa_00;
    *(undefined8 *)&this->field_0x20 = in_XMM1_Qa;
    bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x8);
    if ((bVar1) && (bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x18), bVar1)) {
      return true;
    }
    Destroy(this);
  }
  return false;
}

Assistant:

bool ON_OffsetSurfaceFunction::SetBaseSurface( const ON_Surface* srf )
{
  bool rc = false;
  Destroy();
  m_srf = srf;
  if ( 0 != m_srf )
  {
    m_domain[0] = m_srf->Domain(0);
    m_domain[1] = m_srf->Domain(1);
    rc = m_domain[0].IsIncreasing() && m_domain[1].IsIncreasing();
    if ( !rc )
      Destroy();
  }
  return rc;
}